

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O0

void __thiscall
format::mtx_header_error::mtx_header_error(mtx_header_error *this,string *filename,string *msg)

{
  string local_60;
  string local_40;
  string *local_20;
  string *msg_local;
  string *filename_local;
  mtx_header_error *this_local;
  
  local_20 = msg;
  msg_local = filename;
  filename_local = (string *)this;
  std::__cxx11::string::string((string *)&local_40,(string *)filename);
  std::__cxx11::string::string((string *)&local_60,(string *)msg);
  mtx_error::mtx_error(&this->super_mtx_error,&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  *(undefined ***)&this->super_mtx_error = &PTR__mtx_header_error_00217640;
  return;
}

Assistant:

mtx_header_error (
    std::string filename="Unknown",
    std::string msg="Invalid matrix header"
  )
  : mtx_error(filename, msg)
  {}